

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O1

void ipc_listener_accept(void *arg,nni_aio *aio)

{
  nni_mtx *mtx;
  _Bool _Var1;
  nni_aio *pnVar2;
  nng_err result;
  
  nni_aio_reset(aio);
  mtx = (nni_mtx *)((long)arg + 0x140);
  nni_mtx_lock(mtx);
  if (*(char *)((long)arg + 0x128) == '\0') {
    nni_mtx_unlock(mtx);
    result = NNG_ESTATE;
  }
  else {
    if (*(char *)((long)arg + 0x129) != '\x01') {
      _Var1 = nni_aio_start(aio,ipc_listener_cancel,arg);
      if (_Var1) {
        nni_aio_list_append((nni_list *)((long)arg + 0x110),aio);
        pnVar2 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x110));
        if (pnVar2 == aio) {
          ipc_listener_doaccept((ipc_listener *)arg);
        }
      }
      nni_mtx_unlock(mtx);
      return;
    }
    nni_mtx_unlock(mtx);
    result = NNG_ECLOSED;
  }
  nni_aio_finish_error(aio,result);
  return;
}

Assistant:

static void
ipc_listener_accept(void *arg, nni_aio *aio)
{
	ipc_listener *l = arg;

	// Accept is simpler than the connect case.  With accept we just
	// need to wait for the socket to be readable to indicate an incoming
	// connection is ready for us.  There isn't anything else for us to
	// do really, as that will have been done in listen.
	nni_aio_reset(aio);
	nni_mtx_lock(&l->mtx);

	if (!l->started) {
		nni_mtx_unlock(&l->mtx);
		nni_aio_finish_error(aio, NNG_ESTATE);
		return;
	}
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (!nni_aio_start(aio, ipc_listener_cancel, l)) {
		nni_mtx_unlock(&l->mtx);
		return;
	}
	nni_aio_list_append(&l->acceptq, aio);
	if (nni_list_first(&l->acceptq) == aio) {
		ipc_listener_doaccept(l);
	}
	nni_mtx_unlock(&l->mtx);
}